

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  type_conflict5 tVar5;
  DataKey DVar6;
  undefined8 uVar7;
  DataKey DVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestCo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  double local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_58;
  
  best.m_backend.fpclass = cpp_dec_float_finite;
  best.m_backend.prec_elem = 10;
  best.m_backend.data._M_elems[0] = 0;
  best.m_backend.data._M_elems[1] = 0;
  best.m_backend.data._M_elems[2] = 0;
  best.m_backend.data._M_elems[3] = 0;
  best.m_backend.data._M_elems[4] = 0;
  best.m_backend.data._M_elems[5] = 0;
  best.m_backend.data._M_elems._24_5_ = 0;
  best.m_backend.data._M_elems[7]._1_3_ = 0;
  best.m_backend.data._M_elems._32_5_ = 0;
  best.m_backend._37_8_ = 0;
  bestCo.m_backend.fpclass = cpp_dec_float_finite;
  bestCo.m_backend.prec_elem = 10;
  bestCo.m_backend.data._M_elems[0] = 0;
  bestCo.m_backend.data._M_elems[1] = 0;
  bestCo.m_backend.data._M_elems[2] = 0;
  bestCo.m_backend.data._M_elems[3] = 0;
  bestCo.m_backend.data._M_elems[4] = 0;
  bestCo.m_backend.data._M_elems[5] = 0;
  bestCo.m_backend.data._M_elems._24_5_ = 0;
  bestCo.m_backend.data._M_elems[7]._1_3_ = 0;
  bestCo.m_backend.data._M_elems._32_5_ = 0;
  bestCo.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&best.m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&bestCo.m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->last,1.0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->last,1.0);
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if ((pSVar1->hyperPricingEnter == true) && (this->refined == false)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).updateCount == 0)) {
      if (pSVar1->sparsePricingEnter != true) {
        uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        pnVar9 = &local_98;
        goto LAB_00231452;
      }
      local_58.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_58.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_58.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_58.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_58.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_58.m_backend.exp = (tol->m_backend).exp;
      local_58.m_backend.neg = (tol->m_backend).neg;
      local_58.m_backend.fpclass = (tol->m_backend).fpclass;
      local_58.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)buildBestPriceVectorEnterDim(this,&best,&local_58);
    }
    else if (pSVar1->sparsePricingEnter == true) {
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_d8.m_backend.exp = (tol->m_backend).exp;
      local_d8.m_backend.neg = (tol->m_backend).neg;
      local_d8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_d8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)selectEnterHyperDim(this,&best,&local_d8);
    }
    else {
      uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      pnVar9 = &local_118;
LAB_00231452:
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 8) = uVar7;
      uVar7 = *(undefined8 *)(tol->m_backend).data._M_elems;
      uVar2 = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      uVar3 = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 4) =
           *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 6) = uVar3;
      *(undefined8 *)(pnVar9->m_backend).data._M_elems = uVar7;
      *(undefined8 *)((pnVar9->m_backend).data._M_elems + 2) = uVar2;
      (pnVar9->m_backend).exp = (tol->m_backend).exp;
      (pnVar9->m_backend).neg = (tol->m_backend).neg;
      iVar4 = (tol->m_backend).prec_elem;
      (pnVar9->m_backend).fpclass = (tol->m_backend).fpclass;
      (pnVar9->m_backend).prec_elem = iVar4;
      DVar6 = (DataKey)selectEnterDenseDim(this,&best,pnVar9,0,1);
    }
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (((this->bestPricesCo).super_IdxSet.num < 2) ||
       ((pSVar1->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).updateCount == 0)) {
      if (pSVar1->sparsePricingEnterCo == true) {
        local_158.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_158.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_158.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_158.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_158.m_backend.exp = (tol->m_backend).exp;
        local_158.m_backend.neg = (tol->m_backend).neg;
        local_158.m_backend.fpclass = (tol->m_backend).fpclass;
        local_158.m_backend.prec_elem = (tol->m_backend).prec_elem;
        DVar8 = (DataKey)buildBestPriceVectorEnterCoDim(this,&bestCo,&local_158);
        goto LAB_00231546;
      }
      uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      pnVar9 = &local_198;
    }
    else {
      if (pSVar1->sparsePricingEnterCo == true) {
        local_1d8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_1d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_1d8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_1d8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_1d8.m_backend.exp = (tol->m_backend).exp;
        local_1d8.m_backend.neg = (tol->m_backend).neg;
        local_1d8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_1d8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        DVar8 = (DataKey)selectEnterHyperCoDim(this,&bestCo,&local_1d8);
        goto LAB_00231546;
      }
      uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      pnVar9 = &local_218;
    }
  }
  else {
    if ((pSVar1->sparsePricingEnter == true) && (this->refined == false)) {
      local_258.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_258.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_258.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_258.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_258.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_258.m_backend.exp = (tol->m_backend).exp;
      local_258.m_backend.neg = (tol->m_backend).neg;
      local_258.m_backend.fpclass = (tol->m_backend).fpclass;
      local_258.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)selectEnterSparseDim(this,&best,&local_258);
    }
    else {
      local_298.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_298.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_298.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_298.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_298.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_298.m_backend.exp = (tol->m_backend).exp;
      local_298.m_backend.neg = (tol->m_backend).neg;
      local_298.m_backend.fpclass = (tol->m_backend).fpclass;
      local_298.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar6 = (DataKey)selectEnterDenseDim(this,&best,&local_298,0,1);
    }
    if ((((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->sparsePricingEnterCo == true) && (this->refined == false)) {
      local_2d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_2d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_2d8.m_backend.exp = (tol->m_backend).exp;
      local_2d8.m_backend.neg = (tol->m_backend).neg;
      local_2d8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_2d8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      DVar8 = (DataKey)selectEnterSparseCoDim(this,&bestCo,&local_2d8);
      goto LAB_00231546;
    }
    uVar7 = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    pnVar9 = &local_318;
  }
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 8) = uVar7;
  uVar7 = *(undefined8 *)(tol->m_backend).data._M_elems;
  uVar2 = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
  uVar3 = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 4) =
       *(undefined8 *)((tol->m_backend).data._M_elems + 4);
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 6) = uVar3;
  *(undefined8 *)(pnVar9->m_backend).data._M_elems = uVar7;
  *(undefined8 *)((pnVar9->m_backend).data._M_elems + 2) = uVar2;
  (pnVar9->m_backend).exp = (tol->m_backend).exp;
  (pnVar9->m_backend).neg = (tol->m_backend).neg;
  iVar4 = (tol->m_backend).prec_elem;
  (pnVar9->m_backend).fpclass = (tol->m_backend).fpclass;
  (pnVar9->m_backend).prec_elem = iVar4;
  DVar8 = (DataKey)selectEnterDenseCoDim(this,&bestCo,pnVar9,0,1);
LAB_00231546:
  if (DVar6.info != 0) {
    local_360 = 0.8;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&result.m_backend,&bestCo.m_backend,&local_360);
    tVar5 = boost::multiprecision::operator>
                      (&best,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
    if (tVar5) {
      return (SPxId)DVar6;
    }
    if (DVar8.info == 0) {
      return (SPxId)DVar6;
    }
  }
  return (SPxId)DVar8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}